

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mt19937_64 *R)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  long lVar3;
  parameter_type P_new;
  status_type S_new;
  delim_c local_9fd;
  delim_c local_9fc;
  delim_c local_9fb;
  delim_c local_9fa;
  parameter_type local_9f9;
  delim_str local_9f8;
  status_type local_9f0;
  
  local_9f0.mti = 0;
  memset(local_9f0.mt,0,0x9c0);
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_9f8);
  local_9fa.c = '[';
  pbVar2 = utility::operator>>(in,&local_9fa);
  local_9f8.str = mt19937_64::name();
  pbVar2 = utility::operator>>(pbVar2,&local_9f8);
  local_9fb.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_9fb);
  pbVar2 = operator>>(pbVar2,&local_9f9);
  local_9fc.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_9fc);
  pbVar2 = operator>>(pbVar2,&local_9f0);
  local_9fd.c = ']';
  utility::operator>>(pbVar2,&local_9fd);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    memcpy(&R->S,&local_9f0,0x9c8);
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mt19937_64 &R) {
      mt19937_64::parameter_type P_new;
      mt19937_64::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mt19937_64::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }